

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

void Js::PathTypeHandlerBase::TraceFixedFieldsAfterTypeHandlerChange
               (DynamicObject *instance,DynamicTypeHandler *oldTypeHandler,
               DynamicTypeHandler *newTypeHandler,DynamicType *oldType,DynamicType *newType,
               RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 *puVar4;
  char16_t *pcVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined8 uVar6;
  char16_t *pcVar7;
  undefined8 uVar8;
  char16_t *pcVar9;
  char16_t *pcVar10;
  char16_t *pcVar11;
  undefined8 *puVar3;
  undefined4 extraout_var_00;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_015b6718,FixMethodPropsPhase);
  if ((bVar1) && (DAT_015bc46a == '\x01')) {
    iVar2 = (*oldTypeHandler->_vptr_DynamicTypeHandler[0x5f])(oldTypeHandler);
    puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar2);
    iVar2 = (*newTypeHandler->_vptr_DynamicTypeHandler[0x5f])(newTypeHandler);
    puVar4 = (undefined8 *)CONCAT44(extraout_var_00,iVar2);
    if (puVar3 == (undefined8 *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = *puVar3;
    }
    if (puVar4 == (undefined8 *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = *puVar4;
    }
    Output::Print(L"   after: type = 0x%p, type handler = 0x%p, old singleton = 0x%p(0x%p), new singleton = 0x%p(0x%p)\n"
                  ,newType,newTypeHandler,puVar3,uVar8,puVar4,uVar6);
    Output::Print(L"   fixed fields:");
    (*newTypeHandler->_vptr_DynamicTypeHandler[0x5e])(newTypeHandler);
    Output::Print(L"\n");
    Output::Flush();
  }
  bVar1 = Phases::IsEnabled((Phases *)&DAT_015bc490,FixMethodPropsPhase);
  if ((bVar1) && (DAT_015bc46a == '\x01')) {
    pcVar11 = L"changed";
    pcVar7 = L"changed";
    if (oldTypeHandler == newTypeHandler) {
      pcVar7 = L"unchanged";
    }
    pcVar5 = L"changed";
    if (oldType == newType) {
      pcVar5 = L"unchanged";
    }
    iVar2 = (*oldTypeHandler->_vptr_DynamicTypeHandler[0x5f])(oldTypeHandler);
    pcVar10 = L"!=";
    pcVar9 = L"!=";
    if (CONCAT44(extraout_var_01,iVar2) == 0) {
      pcVar9 = L"==";
    }
    iVar2 = (*oldTypeHandler->_vptr_DynamicTypeHandler[0x5f])(oldTypeHandler);
    if ((RecyclerWeakReference<Js::DynamicObject> *)CONCAT44(extraout_var_02,iVar2) ==
        oldSingletonInstanceBefore) {
      pcVar11 = L"unchanged";
    }
    iVar2 = (*newTypeHandler->_vptr_DynamicTypeHandler[0x5f])(newTypeHandler);
    if (CONCAT44(extraout_var_03,iVar2) == 0) {
      pcVar10 = L"==";
    }
    Output::Print(L"   type %s, typeHandler %s, old singleton after %s null (%s), new singleton after %s null\n"
                  ,pcVar7,pcVar5,pcVar9,pcVar11,pcVar10);
    Output::Print(L"   fixed fields after:");
    (*newTypeHandler->_vptr_DynamicTypeHandler[0x5e])(newTypeHandler);
    Output::Print(L"\n");
    Output::Flush();
    return;
  }
  return;
}

Assistant:

void PathTypeHandlerBase::TraceFixedFieldsAfterTypeHandlerChange(
        DynamicObject* instance, DynamicTypeHandler* oldTypeHandler, DynamicTypeHandler* newTypeHandler,
        DynamicType* oldType, DynamicType* newType, RecyclerWeakReference<DynamicObject>* oldSingletonInstanceBefore)
    {
        if (PHASE_VERBOSE_TRACE1(FixMethodPropsPhase))
        {
            RecyclerWeakReference<DynamicObject>* oldSingletonInstanceAfter = oldTypeHandler->GetSingletonInstance();
            RecyclerWeakReference<DynamicObject>* newSingletonInstanceAfter = newTypeHandler->GetSingletonInstance();
            Output::Print(_u("   after: type = 0x%p, type handler = 0x%p, old singleton = 0x%p(0x%p), new singleton = 0x%p(0x%p)\n"),
                newType, newTypeHandler, oldSingletonInstanceAfter, oldSingletonInstanceAfter != nullptr ? oldSingletonInstanceAfter->Get() : nullptr,
                newSingletonInstanceAfter, newSingletonInstanceAfter != nullptr ? newSingletonInstanceAfter->Get() : nullptr);
            Output::Print(_u("   fixed fields:"));
            newTypeHandler->DumpFixedFields();
            Output::Print(_u("\n"));
            Output::Flush();
        }
        if (PHASE_VERBOSE_TESTTRACE1(FixMethodPropsPhase))
        {
            Output::Print(_u("   type %s, typeHandler %s, old singleton after %s null (%s), new singleton after %s null\n"),
                oldTypeHandler != newTypeHandler ? _u("changed") : _u("unchanged"),
                oldType != newType ? _u("changed") : _u("unchanged"),
                oldTypeHandler->GetSingletonInstance() == nullptr ? _u("==") : _u("!="),
                oldSingletonInstanceBefore != oldTypeHandler->GetSingletonInstance() ? _u("changed") : _u("unchanged"),
                newTypeHandler->GetSingletonInstance() == nullptr ? _u("==") : _u("!="));
            Output::Print(_u("   fixed fields after:"));
            newTypeHandler->DumpFixedFields();
            Output::Print(_u("\n"));
            Output::Flush();
        }
    }